

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O1

string * __thiscall
wabt::LoadStoreTracking::AddrExpName_abi_cxx11_
          (string *__return_storage_ptr__,LoadStoreTracking *this,Node *addr_exp)

{
  size_t sVar1;
  Expr *pEVar2;
  char *__function;
  
  if (addr_exp->etype == LocalTee) {
    pEVar2 = addr_exp->e;
    if (pEVar2->type_ != LocalTee) {
      __function = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::LocalTee>, Base = wabt::Expr]"
      ;
      goto LAB_0015d2c2;
    }
  }
  else {
    if (addr_exp->etype != LocalGet) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
    pEVar2 = addr_exp->e;
    if (pEVar2->type_ != LocalGet) {
      __function = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::LocalGet>, Base = wabt::Expr]"
      ;
LAB_0015d2c2:
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/cast.h"
                    ,0x48,__function);
    }
  }
  if (*(int *)&pEVar2[1].loc.filename._M_str == 1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = pEVar2[1].loc.field_1.field_1.offset;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,sVar1,
               *(long *)((long)&pEVar2[1].loc.field_1 + 8) + sVar1);
    return __return_storage_ptr__;
  }
  __assert_fail("is_name()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                ,0x3e,"const std::string &wabt::Var::name() const");
}

Assistant:

const std::string AddrExpName(const Node& addr_exp) const {
    // TODO: expand this to more kinds of address expressions.
    switch (addr_exp.etype) {
      case ExprType::LocalGet:
        return cast<LocalGetExpr>(addr_exp.e)->var.name();
        break;
      case ExprType::LocalTee:
        return cast<LocalTeeExpr>(addr_exp.e)->var.name();
        break;
      default:
        return "";
    }
  }